

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.cc
# Opt level: O2

void __thiscall
google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event::DeepCopy(Event *this)

{
  DataPiece *this_00;
  Type TVar1;
  StringPiece local_98;
  StringPiece local_88;
  StringPiece local_78;
  undefined1 local_58;
  
  local_78.length_._4_4_ = (undefined4)((ulong)local_78.ptr_ >> 0x20);
  this_00 = &this->value_;
  TVar1 = (this->value_).type_;
  if (TVar1 == TYPE_BYTES) {
    DataPiece::ToBytes_abi_cxx11_
              ((StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_78,this_00);
    StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ValueOrDie((StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_78);
    std::__cxx11::string::_M_assign((string *)&this->value_storage_);
    StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~StatusOr((StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_78);
    StringPiece::StringPiece<std::allocator<char>>(&local_88,&this->value_storage_);
    local_58 = (this->value_).use_strict_base64_decoding_;
    local_78.length_._0_4_ = 10;
    local_78.ptr_ = (char *)&PTR__DataPiece_003e3c20;
  }
  else {
    if (TVar1 != TYPE_STRING) {
      return;
    }
    local_78 = DataPiece::str(this_00);
    StrAppend(&this->value_storage_,(AlphaNum *)&local_78);
    StringPiece::StringPiece<std::allocator<char>>(&local_98,&this->value_storage_);
    local_58 = (this->value_).use_strict_base64_decoding_;
    local_78.length_._0_4_ = 9;
    local_78.ptr_ = (char *)&PTR__DataPiece_003e3c20;
  }
  DataPiece::InternalCopy(this_00,(DataPiece *)&local_78);
  return;
}

Assistant:

void ProtoStreamObjectWriter::AnyWriter::Event::DeepCopy() {
  // DataPiece only contains a string reference. To make sure the referenced
  // string value stays valid, we make a copy of the string value and update
  // DataPiece to reference our own copy.
  if (value_.type() == DataPiece::TYPE_STRING) {
    StrAppend(&value_storage_, value_.str());
    value_ = DataPiece(value_storage_, value_.use_strict_base64_decoding());
  } else if (value_.type() == DataPiece::TYPE_BYTES) {
    value_storage_ = value_.ToBytes().ValueOrDie();
    value_ =
        DataPiece(value_storage_, true, value_.use_strict_base64_decoding());
  }
}